

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

Acb_Ntk_t * Acb_NtkAlloc(Acb_Man_t *p,int NameId,int nCis,int nCos,int nObjs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Acb_Ntk_t *pAVar4;
  void **ppvVar5;
  int *piVar6;
  char *pcVar7;
  uint uVar8;
  
  pAVar4 = (Acb_Ntk_t *)calloc(1,0x238);
  if ((nCos | nCis | nObjs) < 0) {
    __assert_fail("nCis >= 0 && nCos >= 0 && nObjs >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x249,"Acb_Ntk_t *Acb_NtkAlloc(Acb_Man_t *, int, int, int, int)");
  }
  uVar1 = (p->vNtks).nSize;
  pAVar4->Id = uVar1;
  if (uVar1 == (p->vNtks).nCap) {
    if ((int)uVar1 < 0x10) {
      ppvVar5 = (p->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,0x80);
      }
      (p->vNtks).pArray = ppvVar5;
      (p->vNtks).nCap = 0x10;
    }
    else {
      ppvVar5 = (p->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 4);
      }
      (p->vNtks).pArray = ppvVar5;
      (p->vNtks).nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = (p->vNtks).pArray;
  }
  iVar2 = (p->vNtks).nSize;
  (p->vNtks).nSize = iVar2 + 1;
  ppvVar5[iVar2] = pAVar4;
  pAVar4->NameId = NameId;
  pAVar4->pDesign = p;
  if ((pAVar4->vCis).nCap < nCis) {
    piVar6 = (pAVar4->vCis).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)nCis << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)nCis << 2);
    }
    (pAVar4->vCis).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0038e066;
    (pAVar4->vCis).nCap = nCis;
  }
  if ((pAVar4->vCos).nCap < nCos) {
    piVar6 = (pAVar4->vCos).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)nCos << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)nCos << 2);
    }
    (pAVar4->vCos).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0038e066;
    (pAVar4->vCos).nCap = nCos;
  }
  uVar1 = nObjs + 1;
  uVar8 = (pAVar4->vObjType).nCap;
  if ((int)uVar8 <= nObjs) {
    pcVar7 = (pAVar4->vObjType).pArray;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)malloc((ulong)uVar1);
    }
    else {
      pcVar7 = (char *)realloc(pcVar7,(ulong)uVar1);
    }
    (pAVar4->vObjType).pArray = pcVar7;
    (pAVar4->vObjType).nCap = uVar1;
    uVar8 = uVar1;
  }
  if ((pAVar4->vObjType).nSize == uVar8) {
    if ((int)uVar8 < 0x10) {
      pcVar7 = (pAVar4->vObjType).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,0x10);
      }
      (pAVar4->vObjType).pArray = pcVar7;
      (pAVar4->vObjType).nCap = 0x10;
    }
    else {
      uVar8 = uVar8 * 2;
      pcVar7 = (pAVar4->vObjType).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc((ulong)uVar8);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,(ulong)uVar8);
      }
      (pAVar4->vObjType).pArray = pcVar7;
      (pAVar4->vObjType).nCap = uVar8;
    }
  }
  else {
    pcVar7 = (pAVar4->vObjType).pArray;
  }
  iVar2 = (pAVar4->vObjType).nSize;
  (pAVar4->vObjType).nSize = iVar2 + 1;
  pcVar7[iVar2] = '\0';
  if ((pAVar4->vObjFans).nCap <= nObjs) {
    piVar6 = (pAVar4->vObjFans).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar1 << 2);
    }
    (pAVar4->vObjFans).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0038e066;
    (pAVar4->vObjFans).nCap = uVar1;
  }
  Vec_IntPush(&pAVar4->vObjFans,-1);
  iVar3 = nObjs * 3;
  iVar2 = (pAVar4->vFanSto).nCap;
  if (SBORROW4(iVar2,iVar3) != iVar2 + nObjs * -3 < 0) {
    piVar6 = (pAVar4->vFanSto).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)iVar3 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)iVar3 << 2);
    }
    (pAVar4->vFanSto).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0038e066:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pAVar4->vFanSto).nCap = iVar3;
  }
  return pAVar4;
}

Assistant:

static inline Acb_Ntk_t *  Acb_NtkAlloc( Acb_Man_t * p, int NameId, int nCis, int nCos, int nObjs )
{    
    Acb_Ntk_t * pNew = ABC_CALLOC( Acb_Ntk_t, 1 );
    assert( nCis >= 0 && nCos >= 0 && nObjs >= 0 );
    pNew->Id      = Vec_PtrSize(&p->vNtks);   Vec_PtrPush( &p->vNtks, pNew );
    pNew->NameId  = NameId;
    pNew->pDesign = p;
    Vec_IntGrow( &pNew->vCis, nCis );
    Vec_IntGrow( &pNew->vCos, nCos );
    Vec_StrGrow( &pNew->vObjType, nObjs+1 );  Vec_StrPush( &pNew->vObjType,  (char)ABC_OPER_NONE );
    Vec_IntGrow( &pNew->vObjFans, nObjs+1 );  Vec_IntPush( &pNew->vObjFans, -1 );
    Vec_IntGrow( &pNew->vFanSto,  3*nObjs );  
    return pNew;
}